

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O1

LispPTR LCPutIVValue(LispPTR object,LispPTR iv,LispPTR val)

{
  undefined4 *puVar1;
  DLword *pDVar2;
  uint uVar3;
  uint uVar4;
  LispPTR LVar5;
  ulong uVar6;
  uint unaff_R12D;
  int iVar7;
  long lVar8;
  
  if (atom_instance == 0) {
    LCinit();
  }
  uVar4 = *(ushort *)((ulong)(object >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  if ((*(uint *)((long)DTDspace + (ulong)uVar4 * 4 + (ulong)(uVar4 << 5)) & 0xfffffff) ==
      atom_instance) {
    if ((object & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)object);
    }
    pDVar2 = Lisp_world;
    uVar4 = *(uint *)(Lisp_world + (ulong)object + 2);
    uVar6 = (ulong)(((uVar4 ^ iv) & 0x3ff) << 4);
    puVar1 = (undefined4 *)((long)&LCIVCache->iNames + uVar6);
    if ((*(uint *)((long)&LCIVCache->iNames + uVar6) == uVar4) && (puVar1[1] == iv)) {
      unaff_R12D = (uint)*(ushort *)(puVar1 + 2);
      iVar7 = 0;
    }
    else {
      iVar7 = 6;
      if ((*(ushort *)((ulong)(uVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
        uVar3 = 0;
        do {
          unaff_R12D = uVar3;
          LVar5 = car(uVar4);
          if (LVar5 == iv) {
            *puVar1 = *(undefined4 *)(pDVar2 + (ulong)object + 2);
            puVar1[1] = iv;
            puVar1[2] = unaff_R12D | 0xe0000;
            iVar7 = 0;
            break;
          }
          uVar4 = cdr(uVar4);
          uVar3 = unaff_R12D + 1;
        } while (uVar4 != 0);
      }
    }
    if (iVar7 != 6) {
      if (iVar7 != 0) {
        return val;
      }
      uVar4 = *(uint *)(pDVar2 + (ulong)object + 4);
      uVar6 = (ulong)uVar4;
      if ((uVar4 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
      }
      pDVar2 = Lisp_world;
      lVar8 = (long)(int)unaff_R12D;
      uVar4 = *(ushort *)
               ((ulong)(MDStypetbl + (*(uint *)(Lisp_world + uVar6 + lVar8 * 2) >> 9)) ^ 2) & 0x7ff;
      if ((*(uint *)((long)DTDspace + (ulong)uVar4 * 4 + (ulong)(uVar4 << 5)) & 0xfffffff) !=
          atom_annotatedValue) {
        if ((-1 < *(short *)((ulong)(MDStypetbl + (val >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            rec_htfind(val,0);
          }
          else {
            htfind(val,0);
          }
        }
        uVar4 = *(uint *)(pDVar2 + uVar6 + lVar8 * 2);
        if ((-1 < *(short *)((ulong)(uVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            rec_htfind(uVar4,1);
          }
          else {
            htfind(uVar4,1);
          }
        }
        *(LispPTR *)(pDVar2 + uVar6 + lVar8 * 2) = val;
        return val;
      }
    }
  }
  lcfuncall(atom_PutIVValue_LCUFN,3,3);
  return 0xfffffffe;
}

Assistant:

LispPTR LCPutIVValue(LispPTR object, LispPTR iv, LispPTR val) {
  struct LCInstance *objptr;
  LispPTR *valptr;
  int index;

  LC_INIT;
  INSTANCE_OR_PUNT(object, atom_PutIVValue_LCUFN, 3);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  GET_IV_INDEX(objptr, iv, index, goto pnut);
  valptr = &(((LispPTR *)NativeAligned4FromLAddr(objptr->iDescrs))[index]);
  if (!LC_TYPEP(*valptr, atom_annotatedValue)) {
    FRPLPTR((*valptr), val);
    return val;
  }
pnut:
  RETCALL(atom_PutIVValue_LCUFN, 3);
  /*
    return LCPutActiveValue(object,*valptr,val);
  */
}